

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O0

int __thiscall
glcts::ShaderTextureImageSampleFunctionalTest::init
          (ShaderTextureImageSampleFunctionalTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  ShaderTextureImageSampleFunctionalTest *extraout_RAX;
  NotSupportedError *this_00;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  long lStack_18;
  GLint max_image_samples;
  Functions *gl;
  ShaderTextureImageSampleFunctionalTest *this_local;
  
  gl = (Functions *)this;
  ShaderTextureImageSamplesTestBase::init(&this->super_ShaderTextureImageSamplesTestBase,ctx);
  if (*(int *)&(this->super_ShaderTextureImageSamplesTestBase).field_0xa4 == 0) {
    pRVar2 = deqp::Context::getRenderContext
                       ((this->super_ShaderTextureImageSamplesTestBase).super_TestCase.m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[3])();
    lStack_18 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lStack_18 + 0x868))(0x906d,&local_1c);
    err = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(err,"glGetIntegerv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
                    ,0x264);
    this = extraout_RAX;
    if (local_1c == 0) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"GL_MAX_IMAGE_SAMPLES == 0",&local_41);
      tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return (int)this;
}

Assistant:

void ShaderTextureImageSampleFunctionalTest::init()
{
	ShaderTextureImageSamplesTestBase::init();

	if (type_to_test == TEST_TYPE_IMAGE)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		glw::GLint max_image_samples;
		gl.getIntegerv(GL_MAX_IMAGE_SAMPLES, &max_image_samples);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed.");

		if (max_image_samples == 0)
		{
			throw tcu::NotSupportedError("GL_MAX_IMAGE_SAMPLES == 0");
		}
	}
}